

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XercesLocationPath::serialize(XercesLocationPath *this,XSerializeEngine *serEng)

{
  if (serEng->fStoreLoad != 0) {
    XTemplateSerializer::loadObject(&this->fSteps,8,true,serEng);
    return;
  }
  XTemplateSerializer::storeObject(this->fSteps,serEng);
  return;
}

Assistant:

void XercesLocationPath::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {
        /***
         * Serialize RefVectorOf<XercesStep>* fSteps;
         ***/
        XTemplateSerializer::storeObject(fSteps, serEng);
    }
    else
    {
        /***
         * Deserialize RefVectorOf<XercesStep>* fSteps;
         ***/
        XTemplateSerializer::loadObject(&fSteps, 8, true, serEng);
    }
}